

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::ByteArray::ByteArray(ByteArray *this,char *value,size_t n)

{
  string s;
  undefined1 *local_30;
  long local_28;
  undefined1 local_20 [16];
  
  (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_30 = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,value,value + n);
  std::vector<char,std::allocator<char>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((vector<char,std::allocator<char>> *)this,local_30,local_30 + local_28);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

ByteArray::ByteArray(const char* value, std::size_t n)
{
    const std::string s(value, n);
    m_data.assign(s.begin(), s.end());
}